

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O3

bool __thiscall r_exec::PGMOverlay::is_invalidated(PGMOverlay *this)

{
  pointer pPVar1;
  _Object *p_Var2;
  char cVar3;
  pointer pPVar4;
  
  if (this->is_volatile == true) {
    pPVar1 = (this->input_views).
             super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pPVar4 = (this->input_views).
                  super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pPVar4 != pPVar1; pPVar4 = pPVar4 + 1)
    {
      p_Var2 = pPVar4->object;
      if (p_Var2 != (_Object *)0x0) {
        LOCK();
        (p_Var2->refCount).super___atomic_base<long>._M_i =
             (p_Var2->refCount).super___atomic_base<long>._M_i + 1;
        UNLOCK();
      }
      cVar3 = (**(code **)(*p_Var2[2]._vptr__Object + 0x70))();
      if (cVar3 != '\0') {
        LOCK();
        (this->super_InputLessPGMOverlay).super_Overlay.invalidated.
        super___atomic_base<unsigned_long>._M_i = 1;
        UNLOCK();
      }
      LOCK();
      (p_Var2->refCount).super___atomic_base<long>._M_i =
           (p_Var2->refCount).super___atomic_base<long>._M_i + -1;
      UNLOCK();
      if ((p_Var2->refCount).super___atomic_base<long>._M_i < 1) {
        (*p_Var2->_vptr__Object[1])(p_Var2);
      }
      if (cVar3 != '\0') {
        return true;
      }
    }
  }
  return (this->super_InputLessPGMOverlay).super_Overlay.invalidated.
         super___atomic_base<unsigned_long>._M_i == 1;
}

Assistant:

bool PGMOverlay::is_invalidated()
{
    if (is_volatile) {
        for (P<r_code::View> input_view : input_views) {
            if (input_view->object->is_invalidated()) {
                return (invalidated = 1);
            }
        }
    }

    return invalidated == 1;
}